

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolui.c
# Opt level: O0

int fffr8u2(double *input,long ntodo,double scale,double zero,int nullcheck,unsigned_short nullval,
           char *nullarray,int *anynull,unsigned_short *output,int *status)

{
  short sVar1;
  double dVar2;
  short iret;
  short *sptr;
  double dvalue;
  long ii;
  int *anynull_local;
  char *nullarray_local;
  unsigned_short nullval_local;
  int nullcheck_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  double *input_local;
  
  if (nullcheck == 0) {
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      for (ii = 0; ii < ntodo; ii = ii + 1) {
        dVar2 = input[ii] * scale + zero;
        if (-0.49 <= dVar2) {
          if (dVar2 <= 65535.49) {
            output[ii] = (unsigned_short)(int)dVar2;
          }
          else {
            *status = -0xb;
            output[ii] = 0xffff;
          }
        }
        else {
          *status = -0xb;
          output[ii] = 0;
        }
      }
    }
    else {
      for (ii = 0; ii < ntodo; ii = ii + 1) {
        if (-0.49 < input[ii] || input[ii] == -0.49) {
          if (input[ii] <= 65535.49) {
            output[ii] = (unsigned_short)(int)input[ii];
          }
          else {
            *status = -0xb;
            output[ii] = 0xffff;
          }
        }
        else {
          *status = -0xb;
          output[ii] = 0;
        }
      }
    }
  }
  else {
    sptr = (short *)((long)input + 6);
    if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
      for (ii = 0; ii < ntodo; ii = ii + 1) {
        if ((*sptr & 0x7ff0U) == 0x7ff0) {
          sVar1 = 1;
        }
        else {
          sVar1 = 0;
          if ((*sptr & 0x7ff0U) == 0) {
            sVar1 = 2;
          }
        }
        if (sVar1 == 0) {
          dVar2 = input[ii] * scale + zero;
          if (-0.49 <= dVar2) {
            if (dVar2 <= 65535.49) {
              output[ii] = (unsigned_short)(int)dVar2;
            }
            else {
              *status = -0xb;
              output[ii] = 0xffff;
            }
          }
          else {
            *status = -0xb;
            output[ii] = 0;
          }
        }
        else if (sVar1 == 1) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[ii] = nullval;
          }
          else {
            nullarray[ii] = '\x01';
          }
        }
        else if (-0.49 <= zero) {
          if (zero <= 65535.49) {
            output[ii] = (unsigned_short)(int)zero;
          }
          else {
            *status = -0xb;
            output[ii] = 0xffff;
          }
        }
        else {
          *status = -0xb;
          output[ii] = 0;
        }
        sptr = sptr + 4;
      }
    }
    else {
      for (ii = 0; ii < ntodo; ii = ii + 1) {
        if ((*sptr & 0x7ff0U) == 0x7ff0) {
          sVar1 = 1;
        }
        else {
          sVar1 = 0;
          if ((*sptr & 0x7ff0U) == 0) {
            sVar1 = 2;
          }
        }
        if (sVar1 == 0) {
          if (-0.49 < input[ii] || input[ii] == -0.49) {
            if (input[ii] <= 65535.49) {
              output[ii] = (unsigned_short)(int)input[ii];
            }
            else {
              *status = -0xb;
              output[ii] = 0xffff;
            }
          }
          else {
            *status = -0xb;
            output[ii] = 0;
          }
        }
        else if (sVar1 == 1) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[ii] = nullval;
          }
          else {
            nullarray[ii] = '\x01';
          }
        }
        else {
          output[ii] = 0;
        }
        sptr = sptr + 4;
      }
    }
  }
  return *status;
}

Assistant:

int fffr8u2(double *input,        /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
   unsigned short nullval,        /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
   unsigned short *output,        /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to NaN.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;
    short *sptr, iret;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < DUSHRT_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (input[ii] > DUSHRT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = USHRT_MAX;
                }
                else
                    output[ii] = (unsigned short) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DUSHRT_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (dvalue > DUSHRT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = USHRT_MAX;
                }
                else
                    output[ii] = (unsigned short) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        sptr = (short *) input;

#if BYTESWAPPED && MACHINE != VAXVMS && MACHINE != ALPHAVMS
        sptr += 3;       /* point to MSBs */
#endif
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++, sptr += 4)
            {
              if (0 != (iret = dnan(*sptr)) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                     output[ii] = 0;
              }
              else
                {
                    if (input[ii] < DUSHRT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (input[ii] > DUSHRT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = USHRT_MAX;
                    }
                    else
                        output[ii] = (unsigned short) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++, sptr += 4)
            {
              if (0 != (iret = dnan(*sptr)) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {  
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                  { 
                    if (zero < DUSHRT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (zero > DUSHRT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = USHRT_MAX;
                    }
                    else
                      output[ii] = (unsigned short) zero;
                  }
              }
              else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DUSHRT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (dvalue > DUSHRT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = USHRT_MAX;
                    }
                    else
                        output[ii] = (unsigned short) dvalue;
                }
            }
        }
    }
    return(*status);
}